

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp5::groebnerRow9_20000_f
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double factor;
  Index in_stack_fffffffffffffed8;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *in_stack_fffffffffffffee0;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,0x9b7ef0);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b7f11);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b7f3e);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b7f6c);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b7f90);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *pSVar2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar20,auVar36);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b7fe6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b800a);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *pSVar2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar21,auVar37);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b8060);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b8084);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *pSVar2;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar22,auVar38);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b80da);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b80fe);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *pSVar2;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar23,auVar39);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b8154);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b8178);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *pSVar2;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar24,auVar40);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b81ce);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b81f2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *pSVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar25,auVar41);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b8248);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b826c);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SVar1;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *pSVar2;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar10,auVar26,auVar42);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b82c5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b82ec);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SVar1;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *pSVar2;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar11,auVar27,auVar43);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b834b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b8372);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SVar1;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *pSVar2;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar12,auVar28,auVar44);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b83d1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b83f8);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SVar1;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *pSVar2;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar13,auVar29,auVar45);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b8457);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b847e);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = SVar1;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *pSVar2;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar14,auVar30,auVar46);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b84dd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b8504);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = SVar1;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *pSVar2;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar15,auVar31,auVar47);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b8563);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b858a);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = SVar1;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *pSVar2;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar16,auVar32,auVar48);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b85e9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b8610);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = SVar1;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *pSVar2;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar17,auVar33,auVar49);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b866f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b8696);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = SVar1;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *pSVar2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar18,auVar34,auVar50);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b86f5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_fffffffffffffed8,0x9b871c);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = SVar1;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *pSVar2;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar19,auVar35,auVar51);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::groebnerRow9_20000_f( Eigen::Matrix<double,44,80> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,15) / groebnerMatrix(9,63);
  groebnerMatrix(targetRow,15) = 0.0;
  groebnerMatrix(targetRow,16) -= factor * groebnerMatrix(9,64);
  groebnerMatrix(targetRow,17) -= factor * groebnerMatrix(9,65);
  groebnerMatrix(targetRow,18) -= factor * groebnerMatrix(9,66);
  groebnerMatrix(targetRow,19) -= factor * groebnerMatrix(9,67);
  groebnerMatrix(targetRow,20) -= factor * groebnerMatrix(9,68);
  groebnerMatrix(targetRow,21) -= factor * groebnerMatrix(9,69);
  groebnerMatrix(targetRow,22) -= factor * groebnerMatrix(9,70);
  groebnerMatrix(targetRow,23) -= factor * groebnerMatrix(9,71);
  groebnerMatrix(targetRow,24) -= factor * groebnerMatrix(9,72);
  groebnerMatrix(targetRow,25) -= factor * groebnerMatrix(9,73);
  groebnerMatrix(targetRow,54) -= factor * groebnerMatrix(9,74);
  groebnerMatrix(targetRow,55) -= factor * groebnerMatrix(9,75);
  groebnerMatrix(targetRow,56) -= factor * groebnerMatrix(9,76);
  groebnerMatrix(targetRow,57) -= factor * groebnerMatrix(9,77);
  groebnerMatrix(targetRow,58) -= factor * groebnerMatrix(9,78);
  groebnerMatrix(targetRow,73) -= factor * groebnerMatrix(9,79);
}